

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

TX_SIZE av1_get_max_uv_txsize(BLOCK_SIZE bsize,int subsampling_x,int subsampling_y)

{
  BLOCK_SIZE BVar1;
  TX_SIZE TVar2;
  int in_EDX;
  int in_ESI;
  BLOCK_SIZE in_DIL;
  TX_SIZE uv_tx;
  BLOCK_SIZE plane_bsize;
  
  BVar1 = get_plane_block_size(in_DIL,in_ESI,in_EDX);
  TVar2 = av1_get_adjusted_tx_size(""[BVar1]);
  return TVar2;
}

Assistant:

static inline TX_SIZE av1_get_max_uv_txsize(BLOCK_SIZE bsize, int subsampling_x,
                                            int subsampling_y) {
  const BLOCK_SIZE plane_bsize =
      get_plane_block_size(bsize, subsampling_x, subsampling_y);
  assert(plane_bsize < BLOCK_SIZES_ALL);
  const TX_SIZE uv_tx = max_txsize_rect_lookup[plane_bsize];
  return av1_get_adjusted_tx_size(uv_tx);
}